

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O2

void AddRef(int linenum)

{
  SymTab *pSVar1;
  Ref *pRVar2;
  SymTab *pSVar3;
  long lVar4;
  Ref *pRVar5;
  long lVar6;
  Ref *pRVar7;
  
  pSVar1 = SymCurr;
  if ((Pass2 != 0) && (XrefList != 0)) {
    pRVar2 = (Ref *)&Sym->Ref1;
    pRVar7 = (Ref *)0x0;
    while (pRVar2 = pRVar2->NextRef, lVar4 = 2, pRVar2 != (Ref *)0x0) {
      while (lVar6 = lVar4, pRVar7 = pRVar2, lVar6 != 6) {
        lVar4 = lVar6 + 1;
        if (pRVar2->RefNum[lVar6 + -2] == 0) {
          pRVar2->RefNum[lVar6 + -2] = linenum;
          return;
        }
      }
    }
    pRVar2 = RefLim + 1;
    pRVar5 = RefLim;
    RefLim = pRVar2;
    if (0x2000 < (long)pRVar2 - (long)SymCurr) {
      pSVar3 = (SymTab *)malloc(0x2000);
      if (pSVar3 == (SymTab *)0x0) {
        fwrite("     \nOut of memory - cross-reference disabled.\n",0x30,1,_stderr);
        XrefList = 0;
        return;
      }
      pSVar1->Link = pSVar3;
      pSVar3->Link = (SymTab *)0x0;
      pRVar5 = (Ref *)&pSVar3->Hunk;
      RefLim = (Ref *)(pSVar3 + 1);
      SymCurr = pSVar3;
    }
    pRVar5->NextRef = (Ref *)0x0;
    pRVar5->RefNum[0] = linenum;
    for (lVar4 = 3; lVar4 != 6; lVar4 = lVar4 + 1) {
      pRVar5->RefNum[lVar4 + -2] = 0;
    }
    if (pRVar7 == (Ref *)0x0) {
      Sym->Ref1 = pRVar5;
    }
    else {
      pRVar7->NextRef = pRVar5;
    }
  }
  return;
}

Assistant:

void AddRef(linenum)
	int linenum;
/* Adds "linenum" to the list of references
 for the symbol pointed to by Sym.  */
{
	register int i;
	register struct Ref *ref, *prevref;

	if (!Pass2)
		return; /* Pass 2 only! */
	if (!XrefList)
		return; /* No cross-reference */
	prevref = NULL;
	ref = Sym->Ref1;
	while (ref) { /* Chase pointers. */
		for (i = 0; i < MAXREF; i++) { /* Scan reference entry */
			if (ref->RefNum[i] == 0) { /*  for an empty slot.  */
				ref->RefNum[i] = linenum; /* Insert new line number. */
				return;
			}
		}
		prevref = ref; /* Remember where we were. */
		ref = ref->NextRef; /* Link to the next entry. */
	}
	ref = RefLim; /* Pointer to new entry */
	RefLim++; /* Bump limit pointer. */
	if (((char *) RefLim - (char *) SymCurr) > CHUNKSIZE) {
		ref = (struct Ref *) malloc((unsigned) CHUNKSIZE);
		if (ref == NULL) {
			fprintf(stderr, "     \nOut of memory - cross-reference disabled.\n");
			XrefList = FALSE;
			return;
		}
		SymCurr->Link = (struct SymTab *) ref; /* Link from prev. chunk */
		SymCurr = (struct SymTab *) ref; /* Make the new chunk current. */
		SymCurr->Link = NULL; /* Clear forward pointer. */
		ref++; /* Skip over pointer entry. */
		RefLim = ref; /* New table limit */
		RefLim++; /* Bump it. */
	}
	ref->NextRef = NULL; /* Pointer to next entry */
	ref->RefNum[0] = linenum; /* First reference in new entry */
	for (i = 1; i < MAXREF; i++)
		ref->RefNum[i] = 0; /* Clear remaining slots. */
	if (prevref == NULL)
		Sym->Ref1 = ref; /* Link to first entry */
	else
		prevref->NextRef = ref; /* Link to next entry */
}